

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmComputeShaderCase.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)22>_> *
anon_unknown.dwarf_626f6c::createDescriptorSet
          (Move<vk::Handle<(vk::HandleType)22>_> *__return_storage_ptr__,DeviceInterface *vkdi,
          VkDevice *device,VkDescriptorPool pool,VkDescriptorSetLayout layout,size_t numViews,
          vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
          *descriptorInfos)

{
  Handle<(vk::HandleType)22> *pHVar1;
  const_reference pBufferInfo;
  Location local_d0;
  VkDescriptorSet local_c8;
  uint local_c0;
  deUint32 descriptorNdx;
  undefined1 local_b0 [8];
  DescriptorSetUpdateBuilder builder;
  undefined1 local_60 [8];
  VkDescriptorSetAllocateInfo allocInfo;
  size_t numViews_local;
  VkDevice *device_local;
  DeviceInterface *vkdi_local;
  VkDescriptorSetLayout layout_local;
  VkDescriptorPool pool_local;
  Move<vk::Handle<(vk::HandleType)22>_> *descriptorSet;
  
  local_60._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  allocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocInfo._4_4_ = 0;
  allocInfo.descriptorPool.m_internal._0_4_ = 1;
  allocInfo._24_8_ = &vkdi_local;
  builder.m_copies.
  super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  allocInfo.pNext = (void *)pool.m_internal;
  allocInfo.pSetLayouts = (VkDescriptorSetLayout *)numViews;
  vkdi_local = (DeviceInterface *)layout.m_internal;
  layout_local.m_internal = pool.m_internal;
  ::vk::allocateDescriptorSet
            (__return_storage_ptr__,vkdi,*device,(VkDescriptorSetAllocateInfo *)local_60);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)local_b0);
  for (local_c0 = 0; (VkDescriptorSetLayout *)(ulong)local_c0 < allocInfo.pSetLayouts;
      local_c0 = local_c0 + 1) {
    pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                       (&__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    local_c8.m_internal = pHVar1->m_internal;
    local_d0 = ::vk::DescriptorSetUpdateBuilder::Location::binding(local_c0);
    pBufferInfo = std::
                  vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::
                  operator[](descriptorInfos,(ulong)local_c0);
    ::vk::DescriptorSetUpdateBuilder::writeSingle
              ((DescriptorSetUpdateBuilder *)local_b0,local_c8,&local_d0,
               VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,pBufferInfo);
  }
  ::vk::DescriptorSetUpdateBuilder::update((DescriptorSetUpdateBuilder *)local_b0,vkdi,*device);
  builder.m_copies.
  super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)local_b0);
  if ((builder.m_copies.
       super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Move<VkDescriptorSet> createDescriptorSet (const DeviceInterface& vkdi, const VkDevice& device, VkDescriptorPool pool, VkDescriptorSetLayout layout, size_t numViews, const vector<VkDescriptorBufferInfo>& descriptorInfos)
{
	const VkDescriptorSetAllocateInfo	allocInfo	=
	{
		VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
		DE_NULL,
		pool,
		1u,
		&layout
	};

	Move<VkDescriptorSet>				descriptorSet	= allocateDescriptorSet(vkdi, device, &allocInfo);
	DescriptorSetUpdateBuilder			builder;

	for (deUint32 descriptorNdx = 0; descriptorNdx < numViews; ++descriptorNdx)
		builder.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(descriptorNdx), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &descriptorInfos[descriptorNdx]);
	builder.update(vkdi, device);

	return descriptorSet;
}